

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seq.hpp
# Opt level: O1

Maybe<unsigned_long> __thiscall
rc::Seq<unsigned_long>::SeqImpl<rc::shrink::detail::TowardsSeq<unsigned_long>_>::next
          (SeqImpl<rc::shrink::detail::TowardsSeq<unsigned_long>_> *this)

{
  ulong uVar1;
  undefined8 in_RDX;
  ulong uVar2;
  Storage in_RDI;
  Maybe<unsigned_long> MVar3;
  Maybe<unsigned_long> MVar4;
  
  uVar1 = (this->m_impl).m_diff;
  if (uVar1 != 0) {
    uVar2 = -uVar1;
    if ((this->m_impl).m_down == false) {
      uVar2 = uVar1;
    }
    MVar3._8_8_ = uVar2 + (this->m_impl).m_value;
    (this->m_impl).m_diff = uVar1 >> 1;
    *(long *)in_RDI = MVar3._8_8_;
    *(undefined1 *)((long)in_RDI + 8) = 1;
    MVar3.m_storage = in_RDI;
    return MVar3;
  }
  *(undefined1 *)((long)in_RDI + 8) = 0;
  MVar4._8_8_ = in_RDX;
  MVar4.m_storage = in_RDI;
  return MVar4;
}

Assistant:

Maybe<T> next() override { return m_impl(); }